

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
FastHufDecoder_buildTables
          (_internal_exr_context *pctxt,FastHufDecoder *fhd,uint64_t *base,uint64_t *offset)

{
  ulong uVar1;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  int minIdx;
  uint64_t id;
  int codeLen;
  uint64_t value;
  uint64_t i_2;
  int i_1;
  int i;
  int local_54;
  uint local_44;
  ulong local_38;
  int local_30;
  int local_2c;
  
  for (local_2c = 0; local_2c < 0x3b; local_2c = local_2c + 1) {
    if (*(long *)(in_RDX + (long)local_2c * 8) == -1) {
      *(undefined8 *)(in_RSI + 0x40010 + (long)local_2c * 8) = 0xffffffffffffffff;
    }
    else {
      *(long *)(in_RSI + 0x40010 + (long)local_2c * 8) =
           *(long *)(in_RDX + (long)local_2c * 8) << (0x40U - (char)local_2c & 0x3f);
    }
  }
  *(undefined8 *)(in_RSI + 0x401e8) = 0;
  *(long *)(in_RSI + 0x401f0) = *in_RCX - *(long *)(in_RSI + 0x40010);
  for (local_30 = 1; local_30 < 0x3b; local_30 = local_30 + 1) {
    *(ulong *)(in_RSI + 0x401f0 + (long)local_30 * 8) =
         in_RCX[local_30] -
         (*(ulong *)(in_RSI + 0x40010 + (long)local_30 * 8) >> (0x40U - (char)local_30 & 0x3f));
  }
  local_38 = 0;
  do {
    if (0x3fff < local_38) {
      local_54 = 0xe;
      while( true ) {
        bVar2 = false;
        if (0 < local_54) {
          bVar2 = *(long *)(in_RSI + 0x40010 + (long)local_54 * 8) == -1;
        }
        if (!bVar2) break;
        local_54 = local_54 + -1;
      }
      if (local_54 < 0) {
        *(undefined8 *)(in_RSI + 0x503c8) = 0xffffffffffffffff;
      }
      else {
        *(undefined8 *)(in_RSI + 0x503c8) = *(undefined8 *)(in_RSI + 0x40010 + (long)local_54 * 8);
      }
      return 0;
    }
    *(undefined4 *)(in_RSI + 0x403c8 + local_38 * 4) = 0xffff;
    for (local_44 = (uint)*(byte *)(in_RSI + 8); (int)local_44 <= (int)(uint)*(byte *)(in_RSI + 9);
        local_44 = local_44 + 1) {
      if (*(ulong *)(in_RSI + 0x40010 + (long)(int)local_44 * 8) <= local_38 << 0x32) {
        uVar1 = *(long *)(in_RSI + 0x401f0 + (long)(int)local_44 * 8) +
                ((local_38 << 0x32) >> (0x40U - (char)local_44 & 0x3f));
        if ((ulong)(long)*(int *)(in_RSI + 4) <= uVar1) {
          if (in_RDI != 0) {
            (**(code **)(in_RDI + 0x48))(in_RDI,0x17,"Huffman decode error (Overrun)");
          }
          return 0x17;
        }
        *(uint *)(in_RSI + 0x403c8 + local_38 * 4) =
             *(uint *)(in_RSI + 0xc + uVar1 * 4) | local_44 << 0x18;
        break;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static exr_result_t
FastHufDecoder_buildTables (
    const struct _internal_exr_context* pctxt,
    FastHufDecoder*                     fhd,
    uint64_t*                           base,
    uint64_t*                           offset)
{
    //
    // Build the 'left justified' base table, by shifting base left..
    //

    for (int i = 0; i <= MAX_CODE_LEN; ++i)
    {
        if (base[i] != 0xffffffffffffffffULL)
        {
            fhd->_ljBase[i] = base[i] << (64 - i);
        }
        else
        {
            //
            // Unused code length - insert dummy values
            //

            fhd->_ljBase[i] = 0xffffffffffffffffULL;
        }
    }
    fhd->_ljBase[MAX_CODE_LEN + 1] = 0; /* sentinel for brute force lookup */

    //
    // Combine some terms into a big fat constant, which for
    // lack of a better term we'll call the 'left justified'
    // offset table (because it serves the same function
    // as 'offset', when using the left justified base table.
    //

    fhd->_ljOffset[0] = offset[0] - fhd->_ljBase[0];
    for (int i = 1; i <= MAX_CODE_LEN; ++i)
        fhd->_ljOffset[i] = offset[i] - (fhd->_ljBase[i] >> (64 - i));

    //
    // Build the acceleration tables for the lookups of
    // short codes ( <= TABLE_LOOKUP_BITS long)
    //

    for (uint64_t i = 0; i < 1 << TABLE_LOOKUP_BITS; ++i)
    {
        uint64_t value = i << (64 - TABLE_LOOKUP_BITS);

        fhd->_lookupSymbol[i] = 0xffff;

        for (int codeLen = fhd->_minCodeLength; codeLen <= fhd->_maxCodeLength;
             ++codeLen)
        {
            if (fhd->_ljBase[codeLen] <= value)
            {
                uint64_t id =
                    fhd->_ljOffset[codeLen] + (value >> (64 - codeLen));
                if (id < (uint64_t) (fhd->_numSymbols))
                {
                    fhd->_lookupSymbol[i] =
                        (fhd->_idToSymbol[id] | (codeLen << 24));
                }
                else
                {
                    if (pctxt)
                        pctxt->print_error (
                            pctxt,
                            EXR_ERR_CORRUPT_CHUNK,
                            "Huffman decode error (Overrun)");
                    return EXR_ERR_CORRUPT_CHUNK;
                }
                break;
            }
        }
    }

    //
    // Store the smallest value in the table that points to real data.
    // This should be the entry for the largest length that has
    // valid data (in our case, non-dummy _ljBase)
    //

    int minIdx = TABLE_LOOKUP_BITS;

    while (minIdx > 0 && fhd->_ljBase[minIdx] == 0xffffffffffffffffULL)
        minIdx--;

    if (minIdx < 0)
    {
        //
        // Error, no codes with lengths 0-TABLE_LOOKUP_BITS used.
        // Set the min value such that the table is never tested.
        //

        fhd->_tableMin = 0xffffffffffffffffULL;
    }
    else { fhd->_tableMin = fhd->_ljBase[minIdx]; }
    return EXR_ERR_SUCCESS;
}